

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

XMLElement * CS248::Collada::ColladaParser::get_technique_common(XMLElement *xml)

{
  bool bVar1;
  string sid;
  XMLElement *technique;
  XMLElement *common_profile;
  XMLElement *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  XMLElement *in_stack_ffffffffffffff98;
  allocator local_41;
  string local_40 [32];
  XMLElement *local_20;
  XMLElement *local_18;
  XMLElement *local_8;
  
  local_18 = tinyxml2::XMLNode::FirstChildElement
                       ((XMLNode *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                        (char *)in_stack_ffffffffffffff88);
  if (local_18 == (XMLElement *)0x0) {
LAB_001dfa54:
    local_8 = tinyxml2::XMLNode::FirstChildElement
                        ((XMLNode *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         (char *)in_stack_ffffffffffffff88);
  }
  else {
    local_20 = tinyxml2::XMLNode::FirstChildElement
                         ((XMLNode *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          (char *)in_stack_ffffffffffffff88);
    do {
      if (local_20 == (XMLElement *)0x0) goto LAB_001dfa54;
      in_stack_ffffffffffffff98 =
           (XMLElement *)
           tinyxml2::XMLElement::Attribute
                     (in_stack_ffffffffffffff98,
                      (char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      (char *)in_stack_ffffffffffffff88);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,(char *)in_stack_ffffffffffffff98,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                              (char *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff97 = bVar1;
      if (bVar1) {
        local_8 = local_20;
      }
      else {
        in_stack_ffffffffffffff88 =
             tinyxml2::XMLNode::NextSiblingElement
                       ((XMLNode *)CONCAT17(bVar1,in_stack_ffffffffffffff90),
                        (char *)in_stack_ffffffffffffff88);
        local_20 = in_stack_ffffffffffffff88;
      }
      std::__cxx11::string::~string(local_40);
    } while (!bVar1);
  }
  return local_8;
}

Assistant:

XMLElement* ColladaParser::get_technique_common(XMLElement* xml) {
  XMLElement* common_profile = xml->FirstChildElement("profile_COMMON");
  if (common_profile) {
    XMLElement* technique = common_profile->FirstChildElement("technique");
    while (technique) {
      string sid = technique->Attribute("sid");
      if (sid == "common") return technique;
      technique = technique->NextSiblingElement("technique");
    }
  }

  return xml->FirstChildElement("technique_common");
}